

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O2

bool __thiscall CppUnit::Test::findTestPath(Test *this,string *testName,TestPath *testPath)

{
  __type _Var1;
  char cVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  ulong uVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (*this->_vptr_Test[6])(&local_50,this);
  _Var1 = std::operator==(&local_50,testName);
  std::__cxx11::string::~string((string *)&local_50);
  if (_Var1) {
    (*testPath->_vptr_TestPath[3])(testPath,this);
  }
  else {
    uVar3 = (*this->_vptr_Test[4])(this);
    uVar6 = 0;
    uVar5 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar5 = uVar6;
    }
    do {
      if ((int)uVar5 == (int)uVar6) {
        return false;
      }
      iVar4 = (*this->_vptr_Test[5])(this,uVar6);
      cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x38))
                        ((long *)CONCAT44(extraout_var,iVar4),testName,testPath);
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (cVar2 == '\0');
    (*testPath->_vptr_TestPath[5])(testPath,this,0);
  }
  return true;
}

Assistant:

bool 
Test::findTestPath( const std::string &testName,
                    TestPath &testPath ) const
{
  Test *mutableThis = CPPUNIT_CONST_CAST( Test *, this );
  if ( getName() == testName )
  {
    testPath.add( mutableThis );
    return true;
  }

  int childCount = getChildTestCount();
  for ( int childIndex =0; childIndex < childCount; ++childIndex )
  {
    if ( getChildTestAt( childIndex )->findTestPath( testName, testPath ) )
    {
      testPath.insert( mutableThis, 0 );
      return true;
    }
  }

  return false;
}